

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O0

void __thiscall absl::substitute_internal::Arg::Arg(Arg *this,int value)

{
  Nonnull<char_*> pcVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *__str;
  
  __str = in_RDI + 1;
  pcVar1 = numbers_internal::FastIntToBuffer
                     ((int32_t)((ulong)__str >> 0x20),(Nonnull<char_*>)in_RDI);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,(char *)__str,(long)pcVar1 - (long)(in_RDI + 1));
  return;
}

Assistant:

Arg(int value)  // NOLINT(google-explicit-constructor)
      : piece_(scratch_,
               static_cast<size_t>(
                   numbers_internal::FastIntToBuffer(value, scratch_) -
                   scratch_)) {}